

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  uint uVar1;
  word *pwVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  WirePointer *pWVar9;
  WirePointer *pWVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar13;
  Reader RVar14;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  SegmentReader *local_38;
  uint size;
  
  this_00 = &_kjCondition;
  local_38 = this->segment;
  pWVar9 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar9 = this->pointer;
  }
  pWVar10 = pWVar9 + 1;
  uVar1 = (uint)*(uint64_t *)&(pWVar9->offsetAndKind).value;
  lVar8 = (long)((int)uVar1 >> 2);
  if (local_38 == (SegmentReader *)0x0) {
    pWVar12 = pWVar10 + lVar8;
  }
  else {
    pwVar2 = (local_38->ptr).ptr;
    pWVar12 = (WirePointer *)(pwVar2 + (local_38->ptr).size_);
    if (((long)pwVar2 - (long)pWVar10 >> 3 <= lVar8) &&
       (lVar8 <= (long)pWVar12 - (long)pWVar10 >> 3)) {
      pWVar12 = pWVar10 + lVar8;
    }
  }
  if ((pWVar9->field_1).upper32Bits != 0 || uVar1 != 0) {
    pWVar10 = pWVar9;
    if ((local_38 == (SegmentReader *)0x0) || ((uVar1 & 3) != 2)) {
LAB_0014d07e:
      if (pWVar12 == (WirePointer *)0x0) goto LAB_0014d2c4;
LAB_0014d08a:
      this_00 = &_kjCondition;
      uVar1 = (pWVar10->field_1).upper32Bits;
      size = uVar1 >> 3;
      uVar7 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar7);
      _kjCondition.right = anon_var_dwarf_1f258;
      _kjCondition.op.content.ptr = (char *)0x5;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 1);
      if (uVar7 == 1) {
        _kjCondition.left =
             (SegmentReader **)
             (CONCAT71(_kjCondition.left._1_7_,*(byte *)&pWVar10->field_1) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_1f258;
        _kjCondition.op.content.ptr = (char *)0x5;
        bVar13 = (*(byte *)&pWVar10->field_1 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar13);
        if (bVar13) {
          if (local_38 == (SegmentReader *)0x0) {
LAB_0014d1f2:
            _kjCondition.right = (void *)0x0;
            _kjCondition.result = uVar1 >= 8;
            _kjCondition.left = (SegmentReader **)&size;
            _kjCondition.op.content.ptr = " > ";
            _kjCondition.op.content.size_ = 4;
            if (uVar1 < 8) {
              this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[50]>
                        ((Fault *)this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b0,FAILED,"size > ZERO * BYTES",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
            }
            else {
              uVar6 = (ulong)(size - 1);
              _kjCondition.result = *(char *)((long)&(pWVar12->offsetAndKind).value + uVar6) == '\0'
              ;
              _kjCondition.left = (SegmentReader **)((long)&(pWVar12->offsetAndKind).value + uVar6);
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " == ";
              _kjCondition.op.content.size_ = 5;
              if (_kjCondition.result) goto LAB_0014d2d4;
              this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&,char_const(&)[50]>
                        ((Fault *)this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x9b7,FAILED,"cptr[unboundedSize] == \'\\0\'",
                         "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                         (DebugComparison<const_char_&,_char> *)&_kjCondition,
                         (char (*) [50])"Message contains text that is not NUL-terminated.");
            }
          }
          else {
            uVar6 = (ulong)(size + 7 >> 3);
            if (((long)pWVar12 - (long)(local_38->ptr).ptr >> 3) + uVar6 <= (local_38->ptr).size_) {
              uVar11 = local_38->readLimiter->limit;
              if (uVar6 <= uVar11) {
                local_38->readLimiter->limit = uVar11 - uVar6;
                goto LAB_0014d1f2;
              }
              (*local_38->arena->_vptr_Arena[3])();
            }
            newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x9ac,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                       "_kjCondition,\"Message contained out-of-bounds text pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                       ,(DebugExpression<bool> *)&newSegment,
                       (char (*) [320])
                       "Message contained out-of-bounds text pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                      );
          }
        }
        else {
          this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9a6,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where text was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where text was expected."
                    );
        }
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9a0,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where text was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where text was expected.");
      }
    }
    else {
      iVar4 = (*local_38->arena->_vptr_Arena[2])();
      local_38 = (SegmentReader *)CONCAT44(extraout_var,iVar4);
      _kjCondition.left = &local_38;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_38 != (SegmentReader *)0x0;
      if (local_38 == (SegmentReader *)0x0) {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar1 = (uint)*(uint64_t *)&(pWVar9->offsetAndKind).value;
        uVar11 = (ulong)(uVar1 >> 3);
        uVar6 = (local_38->ptr).size_;
        if ((long)uVar6 < (long)uVar11) {
          uVar11 = uVar6;
        }
        uVar5 = 2 - (ulong)((uVar1 & 4) == 0);
        if (uVar5 + uVar11 <= uVar6) {
          pWVar10 = (WirePointer *)((local_38->ptr).ptr + uVar11);
          uVar6 = local_38->readLimiter->limit;
          if (uVar5 <= uVar6) {
            local_38->readLimiter->limit = uVar6 - uVar5;
            if ((*(uint64_t *)&(pWVar9->offsetAndKind).value & 4) != 0) {
              iVar4 = (*local_38->arena->_vptr_Arena[2])
                                (local_38->arena,(ulong)(pWVar10->field_1).upper32Bits);
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = newSegment != (SegmentReader *)0x0;
              if (newSegment == (SegmentReader *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          ((Fault *)&size,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_0014d06d:
                pWVar12 = (WirePointer *)0x0;
                kj::_::Debug::Fault::~Fault((Fault *)&size);
              }
              else {
                uVar1 = (uint)*(uint64_t *)&(pWVar10->offsetAndKind).value;
                uVar7 = uVar1 & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar7);
                _kjCondition.right = anon_var_dwarf_1f258;
                _kjCondition.op.content.ptr = (char *)0x5;
                _kjCondition.op.content.size_ = (size_t)(uVar7 == 2);
                if (uVar7 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            ((Fault *)&size,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_0014d06d;
                }
                uVar6 = (ulong)(uVar1 >> 3);
                sVar3 = (newSegment->ptr).size_;
                if ((long)sVar3 < (long)uVar6) {
                  uVar6 = sVar3;
                }
                pWVar12 = (WirePointer *)((newSegment->ptr).ptr + uVar6);
                local_38 = newSegment;
              }
              pWVar10 = pWVar10 + 1;
              goto LAB_0014d07e;
            }
            pWVar9 = pWVar10 + 1;
            lVar8 = (long)((int)*(uint64_t *)&(pWVar10->offsetAndKind).value >> 2);
            if ((local_38 != (SegmentReader *)0x0) &&
               ((pwVar2 = (local_38->ptr).ptr,
                pWVar12 = (WirePointer *)(pwVar2 + (local_38->ptr).size_),
                lVar8 < (long)pwVar2 - (long)pWVar9 >> 3 ||
                ((long)pWVar12 - (long)pWVar9 >> 3 < lVar8)))) goto LAB_0014d07e;
            pWVar12 = pWVar9 + lVar8;
            goto LAB_0014d08a;
          }
          (*local_38->arena->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
  }
LAB_0014d2c4:
  pWVar12 = (WirePointer *)0x1bf653;
  if (defaultValue != (void *)0x0) {
    pWVar12 = (WirePointer *)defaultValue;
  }
  uVar6 = (ulong)defaultSize;
LAB_0014d2d4:
  RVar14.super_StringPtr.content.size_ = uVar6 + 1;
  RVar14.super_StringPtr.content.ptr = (char *)pWVar12;
  return (Reader)RVar14.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}